

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vfsUnlink(sqlite3_vfs *pVfs)

{
  sqlite3_vfs *psVar1;
  sqlite3_vfs **ppsVar2;
  sqlite3_vfs *psVar3;
  
  if (pVfs != (sqlite3_vfs *)0x0) {
    if (vfsList == pVfs) {
      ppsVar2 = &vfsList;
LAB_0011c374:
      *ppsVar2 = pVfs->pNext;
      return;
    }
    psVar1 = vfsList;
    if (vfsList != (sqlite3_vfs *)0x0) {
      do {
        psVar3 = psVar1;
        psVar1 = psVar3->pNext;
        if (psVar1 == (sqlite3_vfs *)0x0) break;
      } while (psVar1 != pVfs);
      if (psVar1 == pVfs) {
        ppsVar2 = &psVar3->pNext;
        goto LAB_0011c374;
      }
    }
  }
  return;
}

Assistant:

static void vfsUnlink(sqlite3_vfs *pVfs){
  assert( sqlite3_mutex_held(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN)) );
  if( pVfs==0 ){
    /* No-op */
  }else if( vfsList==pVfs ){
    vfsList = pVfs->pNext;
  }else if( vfsList ){
    sqlite3_vfs *p = vfsList;
    while( p->pNext && p->pNext!=pVfs ){
      p = p->pNext;
    }
    if( p->pNext==pVfs ){
      p->pNext = pVfs->pNext;
    }
  }
}